

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcProtectiveDeviceType::~IfcProtectiveDeviceType
          (IfcProtectiveDeviceType *this)

{
  ~IfcProtectiveDeviceType
            ((IfcProtectiveDeviceType *)
             &this[-1].super_IfcFlowControllerType.super_IfcDistributionFlowElementType.
              super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
              super_IfcTypeObject.field_0x48);
  return;
}

Assistant:

IfcProtectiveDeviceType() : Object("IfcProtectiveDeviceType") {}